

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs-libc.c
# Opt level: O0

JSModuleDef * js_init_module_std(JSContext *ctx,char *module_name)

{
  JSModuleDef *m_00;
  JSContext *in_RSI;
  JSModuleDef *in_RDI;
  JSModuleDef *m;
  JSCFunctionListEntry *in_stack_ffffffffffffffd8;
  JSContext *in_stack_fffffffffffffff8;
  
  m_00 = JS_NewCModule(in_stack_fffffffffffffff8,(char *)in_RDI,(JSModuleInitFunc *)in_RSI);
  if (m_00 == (JSModuleDef *)0x0) {
    m_00 = (JSModuleDef *)0x0;
  }
  else {
    JS_AddModuleExportList(in_RSI,m_00,in_stack_ffffffffffffffd8,0);
    JS_AddModuleExport(in_stack_fffffffffffffff8,in_RDI,(char *)in_RSI);
    JS_AddModuleExport(in_stack_fffffffffffffff8,in_RDI,(char *)in_RSI);
    JS_AddModuleExport(in_stack_fffffffffffffff8,in_RDI,(char *)in_RSI);
  }
  return m_00;
}

Assistant:

JSModuleDef *js_init_module_std(JSContext *ctx, const char *module_name)
{
    JSModuleDef *m;
    m = JS_NewCModule(ctx, module_name, js_std_init);
    if (!m)
        return NULL;
    JS_AddModuleExportList(ctx, m, js_std_funcs, countof(js_std_funcs));
    JS_AddModuleExport(ctx, m, "in");
    JS_AddModuleExport(ctx, m, "out");
    JS_AddModuleExport(ctx, m, "err");
    return m;
}